

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glloader.c
# Opt level: O0

ktx_error_code_e
ktxTexture1_GLUpload(ktxTexture1 *This,GLuint *pTexture,GLenum *pTarget,GLenum *pGlerror)

{
  long in_RDX;
  long in_RDI;
  GLenum *unaff_retaddr;
  ktx_glformatinfo formatInfo;
  ktx_error_code_e result;
  GLint previousUnpackAlignment;
  PFNGLGETPROCADDRESS in_stack_ffffffffffffffb8;
  int local_2c [9];
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  ktx_error_code_e kVar1;
  
  if (in_RDI == 0) {
    kVar1 = KTX_INVALID_VALUE;
  }
  else if (in_RDX == 0) {
    kVar1 = KTX_INVALID_VALUE;
  }
  else {
    kVar1 = ktxLoadOpenGL(in_stack_ffffffffffffffb8);
    if (kVar1 == KTX_SUCCESS) {
      (*gl.glGetIntegerv)(0xcf5,local_2c);
      if (local_2c[0] != 4) {
        (*gl.glPixelStorei)(0xcf5,4);
      }
      kVar1 = ktxTexture_GLUploadPrivate
                        (_result,(ktx_glformatinfo *)formatInfo._8_8_,(GLuint *)formatInfo._0_8_,
                         unaff_retaddr,
                         (GLenum *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if (local_2c[0] != 4) {
        (*gl.glPixelStorei)(0xcf5,local_2c[0]);
      }
    }
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxTexture1_GLUpload(ktxTexture1* This, GLuint* pTexture, GLenum* pTarget,
                     GLenum* pGlerror)
{
    GLint                 previousUnpackAlignment;
    KTX_error_code        result = KTX_SUCCESS;
    ktx_glformatinfo      formatInfo;

    if (!This) {
        return KTX_INVALID_VALUE;
    }

    if (!pTarget) {
        return KTX_INVALID_VALUE;
    }

    result = ktxLoadOpenGL(NULL);
    if (result != KTX_SUCCESS) {
        return result;
    }
    /* KTX 1 files require an unpack alignment of 4 */
    glGetIntegerv(GL_UNPACK_ALIGNMENT, &previousUnpackAlignment);
    if (previousUnpackAlignment != KTX_GL_UNPACK_ALIGNMENT) {
        glPixelStorei(GL_UNPACK_ALIGNMENT, KTX_GL_UNPACK_ALIGNMENT);
    }

    formatInfo.glFormat = This->glFormat;
    formatInfo.glInternalformat = This->glInternalformat;
    formatInfo.glBaseInternalformat = This->glBaseInternalformat;
    formatInfo.glType = This->glType;
 
    result = ktxTexture_GLUploadPrivate(ktxTexture(This), &formatInfo,
                                        pTexture, pTarget, pGlerror);

    /* restore previous GL state */
    if (previousUnpackAlignment != KTX_GL_UNPACK_ALIGNMENT) {
        glPixelStorei(GL_UNPACK_ALIGNMENT, previousUnpackAlignment);
    }

    return result;
}